

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int consume_data(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_d_coef_controller *pjVar3;
  long lVar4;
  boolean bVar5;
  int iVar6;
  JBLOCKARRAY ppaJVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  _func_void_j_decompress_ptr *p_Var12;
  long lVar13;
  long lVar14;
  JBLOCKARRAY buffer [4];
  long local_68;
  long alStack_58 [5];
  
  pjVar3 = cinfo->coef;
  if (0 < cinfo->comps_in_scan) {
    lVar14 = 0;
    do {
      JVar1 = cinfo->cur_comp_info[lVar14]->v_samp_factor;
      ppaJVar7 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)
                            (&pjVar3[3].start_output_pass)
                            [cinfo->cur_comp_info[lVar14]->component_index],
                            cinfo->input_iMCU_row * JVar1,JVar1,1);
      alStack_58[lVar14] = (long)ppaJVar7;
      lVar14 = lVar14 + 1;
    } while (lVar14 < cinfo->comps_in_scan);
  }
  iVar6 = *(int *)((long)&pjVar3[1].start_input_pass + 4);
  local_68 = (long)iVar6;
  if (iVar6 < *(int *)&pjVar3[1].consume_data) {
    do {
      uVar9 = *(uint *)&pjVar3[1].start_input_pass;
      if (uVar9 < cinfo->MCUs_per_row) {
        do {
          iVar6 = cinfo->comps_in_scan;
          if (0 < (long)iVar6) {
            lVar14 = 0;
            iVar8 = 0;
            do {
              lVar10 = (long)cinfo->cur_comp_info[lVar14]->MCU_height;
              if (0 < lVar10) {
                iVar2 = cinfo->cur_comp_info[lVar14]->MCU_width;
                lVar4 = alStack_58[lVar14];
                lVar11 = 0;
                do {
                  if (0 < iVar2) {
                    p_Var12 = (_func_void_j_decompress_ptr *)
                              (*(long *)(lVar4 + local_68 * 8 + lVar11 * 8) +
                              (ulong)(iVar2 * uVar9) * 0x80);
                    lVar13 = 0;
                    do {
                      (&pjVar3[1].start_output_pass)[iVar8 + lVar13] = p_Var12;
                      p_Var12 = p_Var12 + 0x80;
                      lVar13 = lVar13 + 1;
                    } while (iVar2 != (int)lVar13);
                    iVar8 = iVar8 + (int)lVar13;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar10);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != iVar6);
          }
          bVar5 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar3[1].start_output_pass);
          if (bVar5 == 0) {
            *(int *)((long)&pjVar3[1].start_input_pass + 4) = (int)local_68;
            *(uint *)&pjVar3[1].start_input_pass = uVar9;
            return 0;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < cinfo->MCUs_per_row);
      }
      *(undefined4 *)&pjVar3[1].start_input_pass = 0;
      local_68 = local_68 + 1;
    } while (local_68 < *(int *)&pjVar3[1].consume_data);
  }
  uVar9 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar9;
  if (uVar9 < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    iVar6 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar6 = 4;
  }
  return iVar6;
}

Assistant:

METHODDEF(int)
consume_data (j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	  for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
	    coef->MCU_buffer[blkn++] = buffer_ptr++;
	  }
	}
      }
      /* Try to fetch the MCU. */
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}